

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

bool __thiscall
HighsMipSolverData::trySolution
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *solution,
          int solution_source)

{
  pointer *ppdVar1;
  int iVar2;
  HighsVarType HVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar8;
  HighsInt j;
  HighsInt end;
  HighsInt start;
  double rowactivity;
  HighsInt i_1;
  HighsInt i;
  HighsCDouble obj;
  double *in_stack_ffffffffffffff68;
  HighsMipSolver *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  HighsMipSolver *pHVar9;
  HighsCDouble *in_stack_ffffffffffffff80;
  int local_4c;
  HighsMipSolver *local_40;
  int local_38;
  int local_34;
  HighsCDouble local_30;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  vector<double,_std::allocator<double>_> *pvVar10;
  vector<double,_std::allocator<double>_> *sol;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar11;
  
  sol = in_RDI;
  sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if ((int)sVar4 ==
      *(int *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[2]) {
    HighsCDouble::HighsCDouble(&local_30,0.0);
    for (local_34 = 0;
        local_34 !=
        *(int *)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[2]; local_34 = local_34 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
      dVar8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start[2] + 0x20),(long)local_34)
      ;
      if (dVar8 < *pvVar5 - (double)in_RDI[0x441].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish) {
        return false;
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
      dVar8 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          ((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start[2] + 0x38),(long)local_34)
      ;
      if (*pvVar5 + (double)in_RDI[0x441].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish < dVar8) {
        return false;
      }
      HVar3 = HighsMipSolver::variableType
                        (in_stack_ffffffffffffff70,
                         (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (HVar3 == kInteger) {
        std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
        dVar8 = fractionality<double>((double)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        ppdVar1 = &in_RDI[0x441].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if ((double)*ppdVar1 <= dVar8 && dVar8 != (double)*ppdVar1) {
          return false;
        }
      }
      HighsMipSolver::colCost
                (in_stack_ffffffffffffff70,(HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_34);
      HighsCDouble::operator+=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    for (local_38 = 0;
        local_38 !=
        *(int *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[2] + 4); local_38 = local_38 + 1) {
      local_40 = (HighsMipSolver *)0x0;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x42c].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)local_38);
      local_4c = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &in_RDI[0x42c].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,(long)(local_38 + 1));
      iVar2 = *pvVar6;
      for (; local_4c != iVar2; local_4c = local_4c + 1) {
        pvVar10 = in_RSI;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &in_RDI[0x42d].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_4c);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar6);
        dVar8 = *pvVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)
                            &in_RDI[0x42e].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_4c);
        local_40 = (HighsMipSolver *)(dVar8 * *pvVar7 + (double)local_40);
        in_RSI = pvVar10;
      }
      pHVar9 = local_40;
      dVar8 = HighsMipSolver::rowUpper
                        (in_stack_ffffffffffffff70,
                         (HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if (dVar8 + (double)in_RDI[0x441].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish < (double)pHVar9) {
        return false;
      }
      dVar8 = HighsMipSolver::rowLower
                        (local_40,(HighsInt)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if ((double)local_40 <
          dVar8 - (double)in_RDI[0x441].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
        return false;
      }
      in_stack_ffffffffffffff70 = local_40;
    }
    HighsCDouble::operator_cast_to_double(&local_30);
    bVar11 = addIncumbent((HighsMipSolverData *)
                          CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),sol,
                          (double)in_RSI,in_EDX,(bool)in_stack_ffffffffffffffe3,
                          (bool)in_stack_ffffffffffffffe2);
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool HighsMipSolverData::trySolution(const std::vector<double>& solution,
                                     const int solution_source) {
  if (int(solution.size()) != mipsolver.model_->num_col_) return false;

  HighsCDouble obj = 0;

  for (HighsInt i = 0; i != mipsolver.model_->num_col_; ++i) {
    if (solution[i] < mipsolver.model_->col_lower_[i] - feastol) return false;
    if (solution[i] > mipsolver.model_->col_upper_[i] + feastol) return false;
    if (mipsolver.variableType(i) == HighsVarType::kInteger &&
        fractionality(solution[i]) > feastol)
      return false;

    obj += mipsolver.colCost(i) * solution[i];
  }

  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double rowactivity = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];

    for (HighsInt j = start; j != end; ++j)
      rowactivity += solution[ARindex_[j]] * ARvalue_[j];

    if (rowactivity > mipsolver.rowUpper(i) + feastol) return false;
    if (rowactivity < mipsolver.rowLower(i) - feastol) return false;
  }

  return addIncumbent(solution, double(obj), solution_source);
}